

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O2

void __thiscall
helics::apps::Source::addPublication
          (Source *this,string_view key,string_view generator,DataType type,Time period,
          string_view units)

{
  bool bVar1;
  string_view type_00;
  string_view key_00;
  iterator iVar2;
  string *psVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  _Elt_pointer pSVar6;
  SourceObject newObj;
  key_type local_228;
  key_type local_218;
  size_t local_208;
  char *pcStack_200;
  Publication local_1f8;
  SourceObject local_130;
  
  local_228._M_str = generator._M_str;
  local_218._M_str = key._M_str;
  local_218._M_len = key._M_len;
  local_228._M_len = generator._M_len;
  iVar2 = CLI::std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::find(&(this->pubids)._M_t,&local_218);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->pubids)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = (this->super_App).useLocal;
    key_00._M_str = local_218._M_str;
    key_00._M_len = local_218._M_len;
    psVar3 = typeNameStringRef_abi_cxx11_(type);
    pcStack_200 = (psVar3->_M_dataplus)._M_p;
    local_208 = psVar3->_M_string_length;
    type_00._M_str = pcStack_200;
    type_00._M_len = local_208;
    Publication::Publication
              (&local_1f8,bVar1 ^ GLOBAL,
               &((this->super_App).fed.
                 super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_ValueFederate,key_00,type_00,(string_view)units);
    SourceObject::SourceObject(&local_130,&local_1f8,period);
    Publication::~Publication(&local_1f8);
    if (generator._M_len != 0) {
      iVar2 = CLI::std::
              _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
              ::find(&(this->generatorLookup)._M_t,&local_228);
      if ((_Rb_tree_header *)iVar2._M_node !=
          &(this->generatorLookup)._M_t._M_impl.super__Rb_tree_header) {
        local_130.generatorIndex = *(int *)&iVar2._M_node[1]._M_left;
      }
    }
    CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::
    emplace_back<helics::apps::SourceObject>(&this->sources,&local_130);
    sVar4 = CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
            ::size(&this->sources);
    pSVar6 = (this->sources).
             super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pSVar6 == (this->sources).
                  super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pSVar6 = (this->sources).
               super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 2;
    }
    psVar3 = Interface::getName_abi_cxx11_((Interface *)(pSVar6 + -1));
    local_1f8.super_Interface.mCore = (Core *)(psVar3->_M_dataplus)._M_p;
    local_1f8.super_Interface._vptr_Interface = (_func_int **)psVar3->_M_string_length;
    pmVar5 = CLI::std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[](&this->pubids,(key_type *)&local_1f8);
    *pmVar5 = (int)sVar4 + -1;
    SourceObject::~SourceObject(&local_130);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"publication already exists\n");
  }
  return;
}

Assistant:

void Source::addPublication(std::string_view key,
                                std::string_view generator,
                                DataType type,
                                Time period,
                                std::string_view units)
    {
        // skip already existing publications
        if (pubids.find(key) != pubids.end()) {
            std::cerr << "publication already exists\n";
            return;
        }
        SourceObject newObj(Publication(useLocal ? InterfaceVisibility::LOCAL :
                                                   InterfaceVisibility::GLOBAL,
                                        fed,
                                        key,
                                        typeNameStringRef(type),
                                        units),
                            period);

        if (!generator.empty()) {
            auto res = generatorLookup.find(generator);
            if (res != generatorLookup.end()) {
                newObj.generatorIndex = res->second;
            }
        }
        sources.push_back(std::move(newObj));
        pubids[sources.back().pub.getName()] = static_cast<int>(sources.size()) - 1;
    }